

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RuntimeCharTrie::Match
          (RuntimeCharTrie *this,Char *input,CharCount inputLength,CharCount *inputOffset,
          RegexStats *stats)

{
  RuntimeCharTrieEntry *pRVar1;
  long lVar2;
  RuntimeCharTrie *curr;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = this->count;
  bVar5 = iVar4 == 0;
  if (*inputOffset < inputLength && !bVar5) {
    uVar3 = (ulong)*inputOffset;
    do {
      if (stats != (RegexStats *)0x0) {
        stats->numCompares = stats->numCompares + 1;
      }
      pRVar1 = this->children;
      lVar2 = 1;
      while( true ) {
        this = &pRVar1->node;
        if (*(Char *)((long)(this + -1) + 8) == input[uVar3]) break;
        if ((ushort)input[uVar3] < (ushort)*(Char *)((long)(this + -1) + 8)) {
          return false;
        }
        pRVar1 = (RuntimeCharTrieEntry *)(this + 1);
        bVar5 = iVar4 <= lVar2;
        lVar2 = lVar2 + 1;
        if (bVar5) {
          return false;
        }
      }
      uVar3 = uVar3 + 1;
      *inputOffset = (CharCount)uVar3;
      iVar4 = this->count;
      bVar5 = iVar4 == 0;
    } while ((!bVar5) && (uVar3 < inputLength));
  }
  return bVar5;
}

Assistant:

bool RuntimeCharTrie::Match
        (const Char* const input
            , const CharCount inputLength
            , CharCount& inputOffset
#if ENABLE_REGEX_CONFIG_OPTIONS
            , RegexStats* stats
#endif
            ) const
    {
        const RuntimeCharTrie* curr = this;
        while (true)
        {
            if (curr->count == 0)
                return true;
            if (inputOffset >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif

#if 0
            int l = 0;
            int h = curr->count - 1;
            while (true)
            {
                if (l > h)
                    return false;
                int m = (l + h) / 2;
                if (curr->children[m].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[m].node;
                    break;
                }
                else if (CTU(curr->children[m].c) < CTU(input[inputOffset]))
                    l = m + 1;
                else
                    h = m - 1;
            }
#else
            int i = 0;
            while (true)
            {
                if (curr->children[i].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[i].node;
                    break;
                }
                else if (curr->children[i].c > input[inputOffset])
                    return false;
                else if (++i >= curr->count)
                    return false;
            }
#endif
        }
    }